

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::SetPipelineState
          (DeviceContextVkImpl *this,IPipelineState *pPipelineState)

{
  PipelineLayoutVk *this_00;
  bool bVar1;
  Uint32 UVar2;
  PipelineStateVkImpl *pPVar3;
  PipelineStateDesc *pPVar4;
  GraphicsPipelineDesc *pGVar5;
  VkPipeline RayTracingPipeline;
  Char *pCVar6;
  reference pvVar7;
  VkPipelineLayout pVVar8;
  PipelineResourceSignatureImplType *this_01;
  PipelineResourceSignatureDesc *pPVar9;
  uint uVar10;
  bool local_161;
  undefined1 local_118 [8];
  string msg_2;
  VkDescriptorSet_T *local_f0;
  PipelineResourceSignatureVkImpl *pSignature;
  DescriptorSetInfo *SetInfo;
  Uint32 i;
  Uint32 TotalDynamicOffsetCount;
  uint local_b8;
  Uint32 local_b4;
  Uint32 sign;
  Uint32 DvpCompatibleSRBCount;
  ResourceBindInfo *BindInfo;
  PipelineLayoutVk *pPStack_a0;
  Uint32 SignCount;
  PipelineLayoutVk *Layout;
  string msg_1;
  string msg;
  GraphicsPipelineDesc *GraphicsPipeline;
  PipelineStateDesc *PSODesc;
  VkPipeline vkPipeline;
  PipelineStateDesc *OldPSODesc;
  bool CommitScissor;
  bool CommitStates;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> local_20;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> pOldPipeline;
  IPipelineState *pPipelineState_local;
  DeviceContextVkImpl *this_local;
  
  pOldPipeline.m_pObject = (PipelineStateVkImpl *)pPipelineState;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::RefCntAutoPtr
            (&local_20,
             &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::SetPipelineState
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,
                     (IPipelineState *)pOldPipeline.m_pObject,
                     (INTERFACE_ID *)PipelineStateVkImpl::IID_InternalImpl);
  if (bVar1) {
    OldPSODesc._6_1_ = 0;
    bVar1 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator!(&local_20);
    if (bVar1) {
      OldPSODesc._7_1_ = 1;
    }
    else {
      pPVar3 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&local_20);
      pPVar4 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                         (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      bVar1 = PipelineStateDesc::IsAnyGraphicsPipeline(pPVar4);
      OldPSODesc._7_1_ = ~bVar1 & 1;
      bVar1 = PipelineStateDesc::IsAnyGraphicsPipeline(pPVar4);
      if (bVar1) {
        pPVar3 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&local_20);
        pGVar5 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                           (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
        OldPSODesc._6_1_ = ((pGVar5->RasterizerDesc).ScissorEnable ^ 0xffU) & 1;
      }
      RefCntAutoPtr<Diligent::PipelineStateVkImpl>::Release(&local_20);
    }
    EnsureVkCmdBuffer(this);
    pPVar3 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    RayTracingPipeline = PipelineStateVkImpl::GetVkPipeline(pPVar3);
    pPVar3 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    pPVar4 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                       (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    switch(pPVar4->PipelineType) {
    case PIPELINE_TYPE_GRAPHICS:
    case PIPELINE_TYPE_MESH:
      pPVar3 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                         (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
      pGVar5 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                         (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      VulkanUtilities::VulkanCommandBuffer::BindGraphicsPipeline
                (&this->m_CommandBuffer,RayTracingPipeline);
      if (OldPSODesc._7_1_ != 0) {
        VulkanUtilities::VulkanCommandBuffer::SetStencilReference
                  (&this->m_CommandBuffer,
                   (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                   super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_StencilRef);
        VulkanUtilities::VulkanCommandBuffer::SetBlendConstants
                  (&this->m_CommandBuffer,
                   (float *)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_BlendFactors);
        CommitViewports(this);
      }
      if ((((pGVar5->RasterizerDesc).ScissorEnable & 1U) != 0) &&
         ((OldPSODesc._7_1_ != 0 || (OldPSODesc._6_1_ != 0)))) {
        CommitScissorRects(this);
      }
      (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      local_161 = false;
      if ((pGVar5->pRenderPass == (IRenderPass *)0x0) &&
         (local_161 = false, pGVar5->NumRenderTargets == '\0')) {
        local_161 = pGVar5->DSVFormat == TEX_FORMAT_UNKNOWN;
      }
      (this->m_State).NullRenderTargets = local_161;
      break;
    case PIPELINE_TYPE_COMPUTE:
      VulkanUtilities::VulkanCommandBuffer::BindComputePipeline
                (&this->m_CommandBuffer,RayTracingPipeline);
      (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
      break;
    case PIPELINE_TYPE_RAY_TRACING:
      VulkanUtilities::VulkanCommandBuffer::BindRayTracingPipeline
                (&this->m_CommandBuffer,RayTracingPipeline);
      (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_RAY_TRACING_KHR;
      break;
    case PIPELINE_TYPE_LAST:
      FormatString<char[26]>
                ((string *)((long)&msg_1.field_2 + 8),(char (*) [26])"Unsupported pipeline type");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x15e);
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
      break;
    default:
      FormatString<char[22]>((string *)&Layout,(char (*) [22])"unknown pipeline type");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetPipelineState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x161);
      std::__cxx11::string::~string((string *)&Layout);
    }
    pPVar3 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    pPStack_a0 = PipelineStateVkImpl::GetPipelineLayout(pPVar3);
    pPVar3 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    BindInfo._4_4_ =
         PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignatureCount
                   (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    _sign = GetBindInfo(this,pPVar4->PipelineType);
    local_b4 = 0;
    DeviceContextBase<Diligent::EngineVkImplTraits>::PrepareCommittedResources
              ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,
               &_sign->super_CommittedShaderResources,&local_b4);
    for (local_b8 = local_b4; local_b8 < BindInfo._4_4_; local_b8 = local_b8 + 1) {
      pvVar7 = std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL>::
               operator[](&_sign->SetInfo,(ulong)local_b8);
      _i = (value_type)0x0;
      std::array<VkDescriptorSet_T_*,_2UL>::fill(&pvVar7->vkSets,(value_type *)&i);
    }
    pVVar8 = PipelineLayoutVk::GetVkPipelineLayout(pPStack_a0);
    _sign->vkPipelineLayout = pVVar8;
    SetInfo._4_4_ = 0;
    for (SetInfo._0_4_ = 0; (uint)SetInfo < BindInfo._4_4_; SetInfo._0_4_ = (uint)SetInfo + 1) {
      pvVar7 = std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL>::
               operator[](&_sign->SetInfo,(ulong)(uint)SetInfo);
      pPVar3 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                         (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
      this_01 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                          (&pPVar3->super_PipelineStateBase<Diligent::EngineVkImplTraits>,
                           (uint)SetInfo);
      if ((this_01 == (PipelineResourceSignatureImplType *)0x0) ||
         (UVar2 = PipelineResourceSignatureVkImpl::GetNumDescriptorSets(this_01), UVar2 == 0)) {
        memset((void *)((long)&msg_2.field_2 + 8),0,0x10);
        (pvVar7->vkSets)._M_elems[0] = (VkDescriptorSet_T *)msg_2.field_2._8_8_;
        (pvVar7->vkSets)._M_elems[1] = local_f0;
        pvVar7->BaseInd = 0;
        pvVar7->DynamicOffsetCount = 0;
        pvVar7->LastBoundBaseInd = 0xffffffff;
      }
      else {
        uVar10 = 1 << ((byte)(uint)SetInfo & 0x1f);
        if (((_sign->super_CommittedShaderResources).ActiveSRBMask & uVar10) == 0) {
          FormatString<char[26],char[35]>
                    ((string *)local_118,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"BindInfo.ActiveSRBMask & (1u << i)",
                     (char (*) [35])(ulong)uVar10);
          pCVar6 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar6,"SetPipelineState",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x180);
          std::__cxx11::string::~string((string *)local_118);
        }
        this_00 = pPStack_a0;
        pPVar9 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                 ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                            *)this_01);
        UVar2 = PipelineLayoutVk::GetFirstDescrSetIndex(this_00,(uint)pPVar9->BindingIndex);
        pvVar7->BaseInd = UVar2;
        UVar2 = PipelineResourceSignatureVkImpl::GetDynamicOffsetCount(this_01);
        pvVar7->DynamicOffsetCount = UVar2;
        SetInfo._4_4_ = pvVar7->DynamicOffsetCount + SetInfo._4_4_;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_DynamicBufferOffsets,(ulong)SetInfo._4_4_);
  }
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::~RefCntAutoPtr(&local_20);
  return;
}

Assistant:

void DeviceContextVkImpl::SetPipelineState(IPipelineState* pPipelineState)
{
    RefCntAutoPtr<PipelineStateVkImpl> pOldPipeline = m_pPipelineState;
    if (!TDeviceContextBase::SetPipelineState(pPipelineState, PipelineStateVkImpl::IID_InternalImpl))
        return;

    bool CommitStates  = false;
    bool CommitScissor = false;
    if (!pOldPipeline)
    {
        // If no pipeline state is bound, we are working with the fresh command
        // list. We have to commit the states set in the context that are not
        // committed by the draw command (render targets, viewports, scissor rects, etc.)
        CommitStates = true;
    }
    else
    {
        const PipelineStateDesc& OldPSODesc = pOldPipeline->GetDesc();
        // Commit all graphics states when switching from non-graphics pipeline
        // This is necessary because if the command list had been flushed
        // and the first PSO set on the command list was a compute pipeline,
        // the states would otherwise never be committed (since m_pPipelineState != nullptr)
        CommitStates = !OldPSODesc.IsAnyGraphicsPipeline();
        // We also need to update scissor rect if ScissorEnable state was disabled in previous pipeline
        if (OldPSODesc.IsAnyGraphicsPipeline())
            CommitScissor = !pOldPipeline->GetGraphicsPipelineDesc().RasterizerDesc.ScissorEnable;
        pOldPipeline.Release();
    }

    EnsureVkCmdBuffer();

    const VkPipeline         vkPipeline = m_pPipelineState->GetVkPipeline();
    const PipelineStateDesc& PSODesc    = m_pPipelineState->GetDesc();

    static_assert(PIPELINE_TYPE_LAST == 4, "Please update the switch below to handle the new pipeline type");
    switch (PSODesc.PipelineType)
    {
        case PIPELINE_TYPE_GRAPHICS:
        case PIPELINE_TYPE_MESH:
        {
            const GraphicsPipelineDesc& GraphicsPipeline = m_pPipelineState->GetGraphicsPipelineDesc();
            m_CommandBuffer.BindGraphicsPipeline(vkPipeline);

            if (CommitStates)
            {
                m_CommandBuffer.SetStencilReference(m_StencilRef);
                m_CommandBuffer.SetBlendConstants(m_BlendFactors);
                CommitViewports();
            }

            if (GraphicsPipeline.RasterizerDesc.ScissorEnable && (CommitStates || CommitScissor))
            {
                CommitScissorRects();
            }
            m_State.vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;

            m_State.NullRenderTargets =
                GraphicsPipeline.pRenderPass == nullptr &&
                GraphicsPipeline.NumRenderTargets == 0 &&
                GraphicsPipeline.DSVFormat == TEX_FORMAT_UNKNOWN;
            break;
        }
        case PIPELINE_TYPE_COMPUTE:
        {
            m_CommandBuffer.BindComputePipeline(vkPipeline);
            m_State.vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
            break;
        }
        case PIPELINE_TYPE_RAY_TRACING:
        {
            m_CommandBuffer.BindRayTracingPipeline(vkPipeline);
            m_State.vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_RAY_TRACING_KHR;
            break;
        }
        case PIPELINE_TYPE_TILE:
            UNEXPECTED("Unsupported pipeline type");
            break;
        default:
            UNEXPECTED("unknown pipeline type");
    }

    const PipelineLayoutVk& Layout    = m_pPipelineState->GetPipelineLayout();
    const Uint32            SignCount = m_pPipelineState->GetResourceSignatureCount();
    ResourceBindInfo&       BindInfo  = GetBindInfo(PSODesc.PipelineType);

    Uint32 DvpCompatibleSRBCount = 0;
    PrepareCommittedResources(BindInfo, DvpCompatibleSRBCount);
#ifdef DILIGENT_DEVELOPMENT
    for (Uint32 sign = DvpCompatibleSRBCount; sign < SignCount; ++sign)
    {
        // Do not clear DescriptorSetBaseInd and DynamicOffsetCount!
        BindInfo.SetInfo[sign].vkSets.fill(VK_NULL_HANDLE);
    }
#endif

    BindInfo.vkPipelineLayout = Layout.GetVkPipelineLayout();

    Uint32 TotalDynamicOffsetCount = 0;
    for (Uint32 i = 0; i < SignCount; ++i)
    {
        ResourceBindInfo::DescriptorSetInfo& SetInfo = BindInfo.SetInfo[i];

        PipelineResourceSignatureVkImpl* pSignature = m_pPipelineState->GetResourceSignature(i);
        if (pSignature == nullptr || pSignature->GetNumDescriptorSets() == 0)
        {
            SetInfo = {};
            continue;
        }

        VERIFY_EXPR(BindInfo.ActiveSRBMask & (1u << i));

        SetInfo.BaseInd            = Layout.GetFirstDescrSetIndex(pSignature->GetDesc().BindingIndex);
        SetInfo.DynamicOffsetCount = pSignature->GetDynamicOffsetCount();
        TotalDynamicOffsetCount += SetInfo.DynamicOffsetCount;
    }

    // Reserve space to store all dynamic buffer offsets
    m_DynamicBufferOffsets.resize(TotalDynamicOffsetCount);
}